

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_interface.c
# Opt level: O3

int fe_parse_general_params(cmd_ln_t *config,fe_t *fe)

{
  bool bVar1;
  uint8 uVar2;
  short sVar3;
  int iVar4;
  int iVar5;
  ps_config_t *ppVar6;
  long lVar7;
  ulong uVar8;
  char *pcVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  double dVar13;
  
  ppVar6 = ps_config_retain(config);
  fe->config = ppVar6;
  lVar7 = ps_config_int(config,"samprate");
  fe->sampling_rate = (float32)(float)lVar7;
  uVar8 = ps_config_int(config,"frate");
  iVar5 = (int)uVar8;
  if (((0x7fff < iVar5) || (iVar5 < 1)) || ((float)fe->sampling_rate < (float)iVar5)) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
            ,0x44,"Frame rate %d can not be bigger than sample rate %.02f\n",
            (double)(float)fe->sampling_rate,uVar8 & 0xffffffff);
    return -1;
  }
  fe->frame_rate = (int16)uVar8;
  iVar4 = ps_config_bool(config,"dither");
  if (iVar4 != 0) {
    fe->dither = '\x01';
    lVar7 = ps_config_int(config,"seed");
    fe->dither_seed = (int32)lVar7;
  }
  pcVar9 = ps_config_str(config,"input_endian");
  iVar4 = strcmp("little",pcVar9);
  fe->swap = (uint8)iVar4;
  dVar13 = ps_config_float(config,"wlen");
  fe->window_length = (float32)(float)dVar13;
  dVar13 = ps_config_float(config,"alpha");
  fe->pre_emphasis_alpha = (float32)(float)dVar13;
  lVar7 = ps_config_int(config,"ncep");
  fe->num_cepstra = (uint8)lVar7;
  lVar7 = ps_config_int(config,"nfft");
  fe->fft_size = (int16)lVar7;
  uVar11 = (uint)((float)fe->window_length * (float)fe->sampling_rate);
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
          ,0x5c,"Frames are %d samples at intervals of %d\n",(ulong)uVar11,
          (ulong)(uint)(int)((float)fe->sampling_rate / (float)iVar5));
  if (0x7fff < (int)uVar11) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
            ,0x60,"Frame size exceeds maximum FFT size (%d > %d)\n",(ulong)uVar11,0x7fff);
    return -1;
  }
  uVar12 = (uint)fe->fft_size;
  if (uVar12 == 0) {
    fe->fft_order = '\0';
    if ((int)uVar11 < 2) {
      uVar8 = 1;
      sVar3 = 1;
    }
    else {
      sVar3 = 1;
      uVar2 = '\0';
      do {
        uVar2 = uVar2 + '\x01';
        sVar3 = sVar3 * 2;
        uVar8 = (ulong)(uint)(int)sVar3;
      } while ((int)sVar3 < (int)uVar11);
      fe->fft_order = uVar2;
    }
    fe->fft_size = sVar3;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
            ,0x6c,"FFT size automatically set to %d\n",uVar8);
  }
  else {
    uVar2 = '\0';
    uVar10 = uVar12;
    if (1 < fe->fft_size) {
      do {
        if ((uVar10 & 1) != 0) {
          fe->fft_order = uVar2;
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                  ,0x73,"fft: number of points must be a power of 2 (is %d)\n");
          return -1;
        }
        uVar2 = uVar2 + '\x01';
        bVar1 = 2 < uVar10;
        uVar10 = uVar10 >> 1;
      } while (bVar1);
    }
    fe->fft_order = uVar2;
    if ((int)uVar12 < (int)uVar11) {
      pcVar9 = "FFT: Number of points must be greater or equal to frame size\n";
      lVar7 = 0x7a;
      goto LAB_00124239;
    }
  }
  iVar5 = ps_config_bool(config,"remove_dc");
  fe->remove_dc = (uint8)iVar5;
  pcVar9 = ps_config_str(config,"transform");
  iVar5 = strcmp(pcVar9,"dct");
  if (iVar5 == 0) {
    uVar2 = '\x01';
  }
  else {
    pcVar9 = ps_config_str(config,"transform");
    iVar5 = strcmp(pcVar9,"legacy");
    if (iVar5 == 0) {
      uVar2 = '\0';
    }
    else {
      pcVar9 = ps_config_str(config,"transform");
      iVar5 = strcmp(pcVar9,"htk");
      if (iVar5 != 0) {
        pcVar9 = "Invalid transform type (values are \'dct\', \'legacy\', \'htk\')\n";
        lVar7 = 0x88;
LAB_00124239:
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                ,lVar7,pcVar9);
        return -1;
      }
      uVar2 = '\x02';
    }
  }
  fe->transform = uVar2;
  iVar5 = ps_config_bool(config,"logspec");
  if (iVar5 != 0) {
    fe->log_spec = '\x01';
  }
  iVar5 = ps_config_bool(config,"smoothspec");
  if (iVar5 != 0) {
    fe->log_spec = '\x02';
    return 0;
  }
  return 0;
}

Assistant:

int
fe_parse_general_params(cmd_ln_t *config, fe_t * fe)
{
    int j, frate, window_samples;

    fe->config = ps_config_retain(config);
    fe->sampling_rate = ps_config_int(config, "samprate");
    frate = ps_config_int(config, "frate");
    if (frate > MAX_INT16 || frate > fe->sampling_rate || frate < 1) {
        E_ERROR
            ("Frame rate %d can not be bigger than sample rate %.02f\n",
             frate, fe->sampling_rate);
        return -1;
    }

    fe->frame_rate = (int16)frate;
    if (ps_config_bool(config, "dither")) {
        fe->dither = 1;
        fe->dither_seed = ps_config_int(config, "seed");
    }
#ifdef WORDS_BIGENDIAN
    /* i.e. if input_endian is *not* "big", then fe->swap is true. */
    fe->swap = strcmp("big", ps_config_str(config, "input_endian"));
#else        
    /* and vice versa */
    fe->swap = strcmp("little", ps_config_str(config, "input_endian"));
#endif
    fe->window_length = ps_config_float(config, "wlen");
    fe->pre_emphasis_alpha = ps_config_float(config, "alpha");

    fe->num_cepstra = (uint8)ps_config_int(config, "ncep");
    fe->fft_size = (int16)ps_config_int(config, "nfft");

    window_samples = (int)(fe->window_length * fe->sampling_rate);
    E_INFO("Frames are %d samples at intervals of %d\n",
           window_samples, (int)(fe->sampling_rate / frate));
    if (window_samples > MAX_INT16) {
        /* This is extremely unlikely! */
        E_ERROR("Frame size exceeds maximum FFT size (%d > %d)\n",
                window_samples, MAX_INT16);
        return -1;
    }

    /* Set FFT size automatically from window size. */
    if (fe->fft_size == 0) {
        fe->fft_order = 0;
        fe->fft_size = (1<<fe->fft_order);
        while (fe->fft_size < window_samples) {
            fe->fft_order++;
            fe->fft_size <<= 1;
        }
        E_INFO("FFT size automatically set to %d\n", fe->fft_size);
    }
    else {
        /* Check FFT size, compute FFT order (log_2(n)) */
        for (j = fe->fft_size, fe->fft_order = 0; j > 1; j >>= 1, fe->fft_order++) {
            if (((j % 2) != 0) || (fe->fft_size <= 0)) {
                E_ERROR("fft: number of points must be a power of 2 (is %d)\n",
                        fe->fft_size);
                return -1;
            }
        }
        /* Verify that FFT size is greater or equal to window length. */
        if (fe->fft_size < window_samples) {
            E_ERROR("FFT: Number of points must be greater or "
                    "equal to frame size\n");
            return -1;
        }
    }

    fe->remove_dc = ps_config_bool(config, "remove_dc");

    if (0 == strcmp(ps_config_str(config, "transform"), "dct"))
        fe->transform = DCT_II;
    else if (0 == strcmp(ps_config_str(config, "transform"), "legacy"))
        fe->transform = LEGACY_DCT;
    else if (0 == strcmp(ps_config_str(config, "transform"), "htk"))
        fe->transform = DCT_HTK;
    else {
        E_ERROR("Invalid transform type (values are 'dct', 'legacy', 'htk')\n");
        return -1;
    }

    if (ps_config_bool(config, "logspec"))
        fe->log_spec = RAW_LOG_SPEC;
    if (ps_config_bool(config, "smoothspec"))
        fe->log_spec = SMOOTH_LOG_SPEC;

    return 0;
}